

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchLiteralNode::AppendLiteral
          (MatchLiteralNode *this,CharCount *litbufNext,CharCount litbufLen,Char *litbuf)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (this->isEquivClass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x323,"(!isEquivClass)","!isEquivClass");
    if (!bVar4) goto LAB_00eab648;
    *puVar5 = 0;
  }
  if ((litbufLen < *litbufNext + this->length) || (litbufLen < this->length + this->offset)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x324,"(litbufNext + length <= litbufLen && offset + length <= litbufLen)",
                       "litbufNext + length <= litbufLen && offset + length <= litbufLen");
    if (!bVar4) {
LAB_00eab648:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  uVar1 = *litbufNext;
  uVar2 = this->length;
  if ((uVar2 + uVar1 <= litbufLen) && (this->offset + uVar2 <= litbufLen)) {
    js_wmemcpy_s(litbuf + uVar1,(ulong)(litbufLen - uVar1),litbuf + this->offset,(ulong)uVar2);
  }
  *litbufNext = *litbufNext + this->length;
  return;
}

Assistant:

void MatchLiteralNode::AppendLiteral(CharCount& litbufNext, CharCount litbufLen, __inout_ecount(litbufLen) Char* litbuf) const
    {
        // Called during parsing only, so literal always in original form
        Assert(!isEquivClass);
        Assert(litbufNext + length <= litbufLen && offset + length <= litbufLen);
#pragma prefast(suppress:26000, "The error said that offset + length >= litbufLen + 1, which is incorrect due to if statement below.")
        if (litbufNext + length <= litbufLen && offset + length <= litbufLen) // for prefast
        {
            js_wmemcpy_s(litbuf + litbufNext, litbufLen - litbufNext, litbuf + offset, length);
        }
        litbufNext += length;
    }